

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O1

int zmq_poller_modify(void *poller_,void *s_,short events_)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = check_poller_registration_args(poller_,s_);
  if (iVar1 != -1) {
    if ((ushort)events_ < 0x10) {
      iVar1 = zmq::socket_poller_t::modify((socket_poller_t *)poller_,(socket_base_t *)s_,events_);
      return iVar1;
    }
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return -1;
}

Assistant:

int zmq_poller_modify (void *poller_, void *s_, short events_)
{
    if (-1 == check_poller_registration_args (poller_, s_)
        || -1 == check_events (events_))
        return -1;

    const zmq::socket_base_t *const socket =
      static_cast<const zmq::socket_base_t *> (s_);

    return (static_cast<zmq::socket_poller_t *> (poller_))
      ->modify (socket, events_);
}